

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestsetStringWithGroupWithoutDelimiter::TestsetStringWithGroupWithoutDelimiter
          (TestsetStringWithGroupWithoutDelimiter *this)

{
  char *suiteName;
  TestsetStringWithGroupWithoutDelimiter *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"setStringWithGroupWithoutDelimiter",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0xd6);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestsetStringWithGroupWithoutDelimiter_00458970;
  return;
}

Assistant:

TEST(setStringWithGroupWithoutDelimiter)
{
  FIX::Message object;
  DataDictionary dataDictionary( "../spec/FIX43.xml" );
  static const char* str =
    "8=FIX.4.3\0019=171\00135=E\00134=126\00149=BUYSIDE\00150=00303\00152"
    "=20040916-16:19:18.328\00156=SELLSIDE\00166=1095350459\00168=2\00173=2\001"
    "67=1\0011=00303\00155=fred\00154=1\00140=1\00159=3\001"
    "67=2\0011=00303\00155=fred\00154=1\00140=1\00159=3\001394=3\00110="
    "054\001";

  object.setString( str, true, &dataDictionary );
  CHECK_EQUAL( str, object.toString() );
}